

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O2

ostream * __thiscall
absl::lts_20250127::str_format_internal::Streamable::Print(Streamable *this,ostream *os)

{
  ulong uVar1;
  bool bVar2;
  Pointer<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> pFVar3;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  FormatRawSinkImpl raw_sink;
  
  uVar1 = (this->args_).storage_.metadata_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if ((uVar1 & 1) == 0) {
    pFVar3 = (Pointer<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>)
             &(this->args_).storage_.data_;
  }
  else {
    pFVar3 = (this->args_).storage_.data_.allocated.allocated_data;
  }
  args.len_ = uVar1 >> 1;
  args.ptr_ = pFVar3;
  raw_sink.write_ = FormatRawSinkImpl::Flush<std::ostream>;
  raw_sink.sink_ = os;
  bVar2 = FormatUntyped(raw_sink,*this->format_,args);
  if (!bVar2) {
    std::ios::setstate((int)*(undefined8 *)(*(long *)os + -0x18) + (int)os);
  }
  return os;
}

Assistant:

std::ostream& Streamable::Print(std::ostream& os) const {
  if (!FormatUntyped(&os, format_, args_)) os.setstate(std::ios::failbit);
  return os;
}